

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O1

short __thiscall
duckdb::DecimalScaleUpOperator::Operation<duckdb::hugeint_t,short>
          (DecimalScaleUpOperator *this,hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  hugeint_t input_00;
  hugeint_t input_01;
  short result;
  short local_42;
  string local_40;
  
  input_00.upper = input.lower;
  iVar2 = 0;
  input_00.lower = (uint64_t)this;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,short>(input_00,&local_42,false);
  if (bVar1) {
    return local_42 * *(short *)(idx + 0x30);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_01.upper = iVar2;
  input_01.lower = input_00.upper;
  CastExceptionText<duckdb::hugeint_t,short>(&local_40,(duckdb *)this,input_01);
  InvalidInputException::InvalidInputException(this_00,&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}